

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  Arena **__mutex;
  vector<char_*,_std::allocator<char_*>_> *this_00;
  long *plVar1;
  char **ppcVar2;
  Logger *info_log;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  Iterator *iter;
  undefined4 extraout_var_00;
  long lVar7;
  Version *in_R8;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar8;
  FileMetaData meta;
  Slice max_user_key;
  Slice min_user_key;
  FileMetaData local_b8;
  Slice local_60;
  string local_50;
  
  __mutex = &mem[1].table_.arena_;
  iVar5 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x15])();
  local_b8.smallest.rep_._M_dataplus._M_p = (pointer)&local_b8.smallest.rep_.field_2;
  local_b8.refs = 0;
  local_b8.allowed_seeks = 0x40000000;
  local_b8.file_size = 0;
  local_b8.smallest.rep_._M_string_length = 0;
  local_b8.smallest.rep_.field_2._M_local_buf[0] = '\0';
  local_b8.largest.rep_._M_dataplus._M_p = (pointer)&local_b8.largest.rep_.field_2;
  local_b8.largest.rep_._M_string_length = 0;
  local_b8.largest.rep_.field_2._M_local_buf[0] = '\0';
  lVar7 = *(long *)&mem[4].table_.max_height_;
  local_b8.number = *(uint64_t *)(lVar7 + 0x48);
  *(uint64_t *)(lVar7 + 0x48) = local_b8.number + 1;
  this_00 = &mem[4].arena_.blocks_;
  std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)this_00,&local_b8.number);
  iter = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",local_b8.number);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  BuildTable((leveldb *)&local_50,(string *)&mem[1].arena_.blocks_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)mem[1].table_.compare_.comparator.super_Comparator._vptr_Comparator,iter,
             &local_b8);
  (this->super_DB)._vptr_DB = (_func_int **)local_50._M_dataplus._M_p;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar4 = local_b8.file_size;
  uVar3 = local_b8.number;
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
  Status::ToString_abi_cxx11_(&local_50,(Status *)this);
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar3,uVar4,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (iter != (Iterator *)0x0) {
    (*iter->_vptr_Iterator[1])();
  }
  pVar8 = std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::equal_range((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)this_00,&local_b8.number);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_erase_aux((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)this_00,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
  if (local_b8.file_size != 0 && (this->super_DB)._vptr_DB == (_func_int **)0x0) {
    if (7 < local_b8.smallest.rep_._M_string_length) {
      local_50._M_string_length = local_b8.smallest.rep_._M_string_length - 8;
      local_50._M_dataplus._M_p = local_b8.smallest.rep_._M_dataplus._M_p;
      if (7 < local_b8.largest.rep_._M_string_length) {
        local_60.size_ = local_b8.largest.rep_._M_string_length - 8;
        local_60.data_ = local_b8.largest.rep_._M_dataplus._M_p;
        if (in_R8 == (Version *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = Version::PickLevelForMemTableOutput(in_R8,(Slice *)&local_50,&local_60);
        }
        VersionEdit::AddFile
                  ((VersionEdit *)base,iVar6,local_b8.number,local_b8.file_size,&local_b8.smallest,
                   &local_b8.largest);
        lVar7 = (long)iVar6;
        goto LAB_0013825a;
      }
    }
    __assert_fail("internal_key.size() >= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                  ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
  }
  lVar7 = 0;
LAB_0013825a:
  iVar6 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x15])();
  plVar1 = (long *)((long)&mem[5].comparator_ + lVar7 * 0x18 + 8);
  *plVar1 = *plVar1 + (CONCAT44(extraout_var_00,iVar6) - CONCAT44(extraout_var,iVar5));
  ppcVar2 = &mem[5].arena_.alloc_ptr_ + lVar7 * 3;
  *ppcVar2 = *ppcVar2 + local_b8.file_size;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.largest.rep_._M_dataplus._M_p != &local_b8.largest.rep_.field_2) {
    operator_delete(local_b8.largest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.smallest.rep_._M_dataplus._M_p != &local_b8.smallest.rep_.field_2) {
    operator_delete(local_b8.smallest.rep_._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}